

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

opj_tgt_tree_t *
opj_tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v,
            opj_event_mgr_t *p_manager)

{
  int iVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  opj_tgt_node_t *poVar5;
  opj_tgt_node_t *new_nodes;
  OPJ_UINT32 l_node_size;
  OPJ_UINT32 n;
  OPJ_UINT32 l_num_levels;
  OPJ_INT32 k;
  OPJ_INT32 j;
  OPJ_UINT32 i;
  opj_tgt_node_t *l_parent_node0;
  opj_tgt_node_t *l_parent_node;
  opj_tgt_node_t *l_node;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 p_num_leafs_v_local;
  OPJ_UINT32 p_num_leafs_h_local;
  opj_tgt_tree_t *p_tree_local;
  
  if (p_tree == (opj_tgt_tree_t *)0x0) {
    p_tree_local = (opj_tgt_tree_t *)0x0;
  }
  else {
    if ((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v)) {
      p_tree->numleafsh = p_num_leafs_h;
      p_tree->numleafsv = p_num_leafs_v;
      l_node_size = 0;
      l_nplv[0x1e] = p_num_leafs_h;
      p_tree->numnodes = 0;
      OVar3 = l_node_size;
      do {
        l_node_size = OVar3;
        iVar1 = l_nplv[(ulong)l_node_size + 0x1e];
        iVar2 = l_nplv[(ulong)l_node_size - 2];
        l_nplv[(ulong)(l_node_size + 1) + 0x1e] = (l_nplv[(ulong)l_node_size + 0x1e] + 1) / 2;
        l_nplv[(ulong)(l_node_size + 1) - 2] = (l_nplv[(ulong)l_node_size - 2] + 1) / 2;
        p_tree->numnodes = iVar1 * iVar2 + p_tree->numnodes;
        OVar3 = l_node_size + 1;
      } while (1 < (uint)(iVar1 * iVar2));
      if (p_tree->numnodes == 0) {
        opj_tgt_destroy(p_tree);
        return (opj_tgt_tree_t *)0x0;
      }
      uVar4 = p_tree->numnodes * 0x18;
      if (p_tree->nodes_size < uVar4) {
        poVar5 = (opj_tgt_node_t *)opj_realloc(p_tree->nodes,(ulong)uVar4);
        if (poVar5 == (opj_tgt_node_t *)0x0) {
          opj_event_msg(p_manager,1,"Not enough memory to reinitialize the tag tree\n");
          opj_tgt_destroy(p_tree);
          return (opj_tgt_tree_t *)0x0;
        }
        p_tree->nodes = poVar5;
        memset((void *)((long)&p_tree->nodes->parent + (ulong)p_tree->nodes_size),0,
               (ulong)(uVar4 - p_tree->nodes_size));
        p_tree->nodes_size = uVar4;
      }
      l_parent_node = p_tree->nodes;
      _j = p_tree->nodes + p_tree->numleafsh * p_tree->numleafsv;
      l_parent_node0 = _j;
      for (k = 0; (uint)k < l_node_size; k = k + 1) {
        for (l_num_levels = 0; (int)l_num_levels < l_nplv[(ulong)(uint)k - 2];
            l_num_levels = l_num_levels + 1) {
          n = l_nplv[(ulong)(uint)k + 0x1e];
          while (-1 < (int)(n - 1)) {
            l_parent_node->parent = l_parent_node0;
            n = n - 2;
            poVar5 = l_parent_node + 1;
            if (-1 < (int)n) {
              l_parent_node[1].parent = l_parent_node0;
              poVar5 = l_parent_node + 2;
            }
            l_parent_node = poVar5;
            l_parent_node0 = l_parent_node0 + 1;
          }
          if (((l_num_levels & 1) == 0) && (l_num_levels != l_nplv[(ulong)(uint)k - 2] - 1U)) {
            l_parent_node0 = _j;
            _j = _j + l_nplv[(ulong)(uint)k + 0x1e];
          }
          else {
            _j = l_parent_node0;
          }
        }
      }
      l_parent_node->parent = (opj_tgt_node *)0x0;
    }
    opj_tgt_reset(p_tree);
    p_tree_local = p_tree;
  }
  return p_tree_local;
}

Assistant:

opj_tgt_tree_t *opj_tgt_init(opj_tgt_tree_t * p_tree, OPJ_UINT32 p_num_leafs_h,
                             OPJ_UINT32 p_num_leafs_v, opj_event_mgr_t *p_manager)
{
    OPJ_INT32 l_nplh[32];
    OPJ_INT32 l_nplv[32];
    opj_tgt_node_t *l_node = 00;
    opj_tgt_node_t *l_parent_node = 00;
    opj_tgt_node_t *l_parent_node0 = 00;
    OPJ_UINT32 i;
    OPJ_INT32 j, k;
    OPJ_UINT32 l_num_levels;
    OPJ_UINT32 n;
    OPJ_UINT32 l_node_size;

    if (! p_tree) {
        return 00;
    }

    if ((p_tree->numleafsh != p_num_leafs_h) ||
            (p_tree->numleafsv != p_num_leafs_v)) {
        p_tree->numleafsh = p_num_leafs_h;
        p_tree->numleafsv = p_num_leafs_v;

        l_num_levels = 0;
        l_nplh[0] = (OPJ_INT32)p_num_leafs_h;
        l_nplv[0] = (OPJ_INT32)p_num_leafs_v;
        p_tree->numnodes = 0;
        do {
            n = (OPJ_UINT32)(l_nplh[l_num_levels] * l_nplv[l_num_levels]);
            l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
            l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
            p_tree->numnodes += n;
            ++l_num_levels;
        } while (n > 1);

        /* ADD */
        if (p_tree->numnodes == 0) {
            opj_tgt_destroy(p_tree);
            return 00;
        }
        l_node_size = p_tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

        if (l_node_size > p_tree->nodes_size) {
            opj_tgt_node_t* new_nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes,
                                        l_node_size);
            if (! new_nodes) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Not enough memory to reinitialize the tag tree\n");
                opj_tgt_destroy(p_tree);
                return 00;
            }
            p_tree->nodes = new_nodes;
            memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0,
                   l_node_size - p_tree->nodes_size);
            p_tree->nodes_size = l_node_size;
        }
        l_node = p_tree->nodes;
        l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
        l_parent_node0 = l_parent_node;

        for (i = 0; i < l_num_levels - 1; ++i) {
            for (j = 0; j < l_nplv[i]; ++j) {
                k = l_nplh[i];
                while (--k >= 0) {
                    l_node->parent = l_parent_node;
                    ++l_node;
                    if (--k >= 0) {
                        l_node->parent = l_parent_node;
                        ++l_node;
                    }
                    ++l_parent_node;
                }
                if ((j & 1) || j == l_nplv[i] - 1) {
                    l_parent_node0 = l_parent_node;
                } else {
                    l_parent_node = l_parent_node0;
                    l_parent_node0 += l_nplh[i];
                }
            }
        }
        l_node->parent = 0;
    }
    opj_tgt_reset(p_tree);

    return p_tree;
}